

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_11::VersionEditPrinter
          (anon_unknown_11 *this,uint64_t pos,Slice record,WritableFile *dst)

{
  string *str;
  Status s;
  string r;
  VersionEdit edit;
  undefined1 local_138 [44];
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [16];
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  VersionEdit local_d8;
  
  local_e0 = (pointer)record.data_;
  str = (string *)(local_138 + 8);
  local_138._8_8_ = local_138 + 0x18;
  local_e8 = (pointer)pos;
  std::__cxx11::string::_M_construct<char_const*>((string *)str,"--- offset ","");
  AppendNumberTo(str,(uint64_t)this);
  std::__cxx11::string::append((char *)str);
  local_d8.comparator_._M_dataplus._M_p = (pointer)&local_d8.comparator_.field_2;
  local_d8.comparator_._M_string_length = 0;
  local_d8.comparator_.field_2._M_local_buf[0] = '\0';
  local_d8.compact_pointers_.
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.compact_pointers_.
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.compact_pointers_.
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  VersionEdit::Clear(&local_d8);
  VersionEdit::DecodeFrom((VersionEdit *)local_138,(Slice *)&local_d8);
  if ((pointer)local_138._0_8_ == (pointer)0x0) {
    VersionEdit::DebugString_abi_cxx11_((string *)(local_138 + 0x28),&local_d8);
    std::__cxx11::string::_M_append(local_138 + 8,CONCAT44(uStack_10c,local_138._40_4_));
    if ((undefined1 *)CONCAT44(uStack_10c,local_138._40_4_) != local_100) {
      operator_delete((undefined1 *)CONCAT44(uStack_10c,local_138._40_4_));
    }
  }
  else {
    Status::ToString_abi_cxx11_((string *)(local_138 + 0x28),(Status *)local_138);
    std::__cxx11::string::_M_append(local_138 + 8,CONCAT44(uStack_10c,local_138._40_4_));
    if ((undefined1 *)CONCAT44(uStack_10c,local_138._40_4_) != local_100) {
      operator_delete((undefined1 *)CONCAT44(uStack_10c,local_138._40_4_));
    }
    std::__cxx11::string::push_back((char)local_138 + '\b');
  }
  local_138._40_4_ = local_138._8_4_;
  uStack_10c = local_138._12_4_;
  uStack_108 = local_138._16_4_;
  uStack_104 = local_138._20_4_;
  (**(code **)(*(long *)record.size_ + 0x10))(&local_f0,(long *)record.size_);
  if (local_f0 != (pointer)0x0) {
    operator_delete__(local_f0);
  }
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    operator_delete__((void *)local_138._0_8_);
  }
  VersionEdit::~VersionEdit(&local_d8);
  if ((undefined1 *)local_138._8_8_ != local_138 + 0x18) {
    operator_delete((void *)local_138._8_8_);
  }
  return;
}

Assistant:

static void VersionEditPrinter(uint64_t pos, Slice record, WritableFile* dst) {
  std::string r = "--- offset ";
  AppendNumberTo(&r, pos);
  r += "; ";
  VersionEdit edit;
  Status s = edit.DecodeFrom(record);
  if (!s.ok()) {
    r += s.ToString();
    r.push_back('\n');
  } else {
    r += edit.DebugString();
  }
  dst->Append(r);
}